

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O2

void jbcoin::RPC::inject_error<Json::Value>(error_code_i code,Value *json)

{
  ErrorInfo *pEVar1;
  Value *pVVar2;
  ValueHolder local_28;
  undefined2 local_20;
  
  pEVar1 = get_error_info(code);
  Json::Value::Value((Value *)&local_28,&pEVar1->token);
  pVVar2 = Json::Value::operator[](json,(StaticString *)&jss::error);
  Json::Value::swap(pVVar2,(Value *)&local_28);
  Json::Value::~Value((Value *)&local_28);
  local_28.int_ = pEVar1->code;
  local_20 = 1;
  pVVar2 = Json::Value::operator[](json,(StaticString *)&jss::error_code);
  Json::Value::swap(pVVar2,(Value *)&local_28);
  Json::Value::~Value((Value *)&local_28);
  Json::Value::Value((Value *)&local_28,&pEVar1->message);
  pVVar2 = Json::Value::operator[](json,(StaticString *)&jss::error_message);
  Json::Value::swap(pVVar2,(Value *)&local_28);
  Json::Value::~Value((Value *)&local_28);
  return;
}

Assistant:

void inject_error (error_code_i code, JsonValue& json)
{
    ErrorInfo const& info (get_error_info (code));
    json [jss::error] = info.token;
    json [jss::error_code] = info.code;
    json [jss::error_message] = info.message;
}